

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O3

int trytop(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *pxVar1;
  xmlAttr *attr;
  rnndb *prVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint64_t uVar8;
  rnnenum *prVar9;
  rnnbitset *prVar10;
  rnngroup *prVar11;
  rnnenum **pprVar12;
  rnnvalue *prVar13;
  rnnvalue **__ptr;
  char *pcVar14;
  rnndomain *prVar15;
  rnnbitset **pprVar16;
  rnnbitfield *prVar17;
  rnnbitfield **__ptr_00;
  rnnspectype *prVar18;
  rnngroup **pprVar19;
  rnndomain **pprVar20;
  rnnspectype **pprVar21;
  rnnauthor *prVar22;
  char *pcVar23;
  char **__ptr_01;
  rnnauthor **__ptr_02;
  rnndelem *prVar24;
  rnndelem **pprVar25;
  ulong uVar26;
  xmlNode *node_00;
  xmlNode *node_01;
  xmlNode *node_02;
  xmlNode *node_03;
  xmlNode *node_04;
  long lVar27;
  _xmlNode *p_Var28;
  _xmlAttr *p_Var29;
  _xmlNode *p_Var30;
  char *local_58;
  char *local_50;
  char *local_48;
  uint64_t local_40;
  char *local_38;
  
  pxVar1 = node->name;
  iVar3 = strcmp((char *)pxVar1,"enum");
  if (iVar3 == 0) {
    p_Var29 = node->properties;
    if (p_Var29 != (_xmlAttr *)0x0) {
      local_50 = (char *)0x0;
      local_58 = (char *)0x0;
      local_48 = (char *)0x0;
      iVar3 = 0;
      iVar6 = 0;
      pcVar23 = (char *)0x0;
      do {
        pxVar1 = p_Var29->name;
        iVar5 = strcmp((char *)pxVar1,"name");
        if (iVar5 == 0) {
          pcVar23 = getattrib(db,file,(uint)node->line,p_Var29);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"bare");
          if (iVar5 == 0) {
            iVar3 = getboolattrib(db,file,(uint)node->line,p_Var29);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"inline");
            if (iVar5 == 0) {
              iVar6 = getboolattrib(db,file,(uint)node->line,p_Var29);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"prefix");
              if (iVar5 == 0) {
                pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                local_48 = strdup(pcVar14);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"varset");
                if (iVar5 == 0) {
                  pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                  local_58 = strdup(pcVar14);
                }
                else {
                  iVar5 = strcmp((char *)pxVar1,"variants");
                  if (iVar5 == 0) {
                    pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                    local_50 = strdup(pcVar14);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for enum\n",file,
                            (ulong)node->line,pxVar1);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
        p_Var29 = p_Var29->next;
      } while (p_Var29 != (_xmlAttr *)0x0);
      if (pcVar23 != (char *)0x0) {
        iVar5 = db->enumsnum;
        if (0 < (long)iVar5) {
          pprVar12 = db->enums;
          lVar27 = 0;
          do {
            prVar9 = pprVar12[lVar27];
            iVar4 = strcmp(prVar9->name,pcVar23);
            if (iVar4 == 0) {
              pcVar23 = (prVar9->varinfo).prefixstr;
              if (((((local_48 != (char *)0x0 || pcVar23 != (char *)0x0) &&
                    (((local_48 == (char *)0x0 || (pcVar23 == (char *)0x0)) ||
                     (iVar5 = strcmp(pcVar23,local_48), iVar5 != 0)))) ||
                   ((pcVar23 = (prVar9->varinfo).varsetstr,
                    local_58 != (char *)0x0 || pcVar23 != (char *)0x0 &&
                    (((local_58 == (char *)0x0 || (pcVar23 == (char *)0x0)) ||
                     (iVar5 = strcmp(pcVar23,local_58), iVar5 != 0)))))) ||
                  ((pcVar23 = (prVar9->varinfo).variantsstr,
                   local_50 != (char *)0x0 || pcVar23 != (char *)0x0 &&
                   (((local_50 == (char *)0x0 || (pcVar23 == (char *)0x0)) ||
                    (iVar5 = strcmp(pcVar23,local_50), iVar5 != 0)))))) ||
                 ((prVar9->isinline != iVar6 || (prVar9->bare != iVar3)))) {
                fprintf(_stderr,"%s:%d: merge fail for enum %s\n",file,(ulong)node->line,node->name)
                ;
                db->estatus = 1;
              }
              free(local_48);
              free(local_58);
              free(local_50);
              goto LAB_00102e4f;
            }
            lVar27 = lVar27 + 1;
          } while (iVar5 != lVar27);
        }
        prVar9 = (rnnenum *)calloc(0x78,1);
        pcVar23 = strdup(pcVar23);
        prVar9->name = pcVar23;
        prVar9->isinline = iVar6;
        prVar9->bare = iVar3;
        (prVar9->varinfo).prefixstr = local_48;
        (prVar9->varinfo).varsetstr = local_58;
        (prVar9->varinfo).variantsstr = local_50;
        prVar9->file = file;
        iVar3 = db->enumsmax;
        if (iVar5 < iVar3) {
          pprVar12 = db->enums;
        }
        else {
          iVar6 = 0x10;
          if (iVar3 != 0) {
            iVar6 = iVar3 * 2;
          }
          db->enumsmax = iVar6;
          pprVar12 = (rnnenum **)realloc(db->enums,(long)iVar6 << 3);
          db->enums = pprVar12;
          iVar5 = db->enumsnum;
        }
        db->enumsnum = iVar5 + 1;
        pprVar12[iVar5] = prVar9;
LAB_00102e4f:
        p_Var30 = node->children;
        if (p_Var30 != (_xmlNode *)0x0) {
          do {
            if (p_Var30->type == XML_ELEMENT_NODE) {
              iVar3 = strcmp((char *)p_Var30->name,"value");
              if (iVar3 == 0) {
                prVar13 = parsevalue(db,file,p_Var30);
                if (prVar13 != (rnnvalue *)0x0) {
                  iVar3 = prVar9->valsnum;
                  iVar6 = prVar9->valsmax;
                  __ptr = prVar9->vals;
                  if (iVar6 <= iVar3) {
                    iVar3 = iVar6 * 2;
                    if (iVar6 == 0) {
                      iVar3 = 0x10;
                    }
                    prVar9->valsmax = iVar3;
                    __ptr = (rnnvalue **)realloc(__ptr,(long)iVar3 << 3);
                    prVar9->vals = __ptr;
                    iVar3 = prVar9->valsnum;
                  }
                  prVar9->valsnum = iVar3 + 1;
                  __ptr[iVar3] = prVar13;
                }
              }
              else {
                pcVar23 = file;
                iVar3 = trytop(db,file,p_Var30);
                if (iVar3 == 0) {
                  prVar2 = (rnndb *)p_Var30->name;
                  iVar3 = trydoc(prVar2,pcVar23,node_00);
                  if (iVar3 == 0) {
                    fprintf(_stderr,"%s:%d: wrong tag in enum: <%s>\n",file,(ulong)p_Var30->line,
                            prVar2);
                    db->estatus = 1;
                  }
                }
              }
            }
            p_Var30 = p_Var30->next;
          } while (p_Var30 != (_xmlNode *)0x0);
          return 1;
        }
        return 1;
      }
    }
    uVar26 = (ulong)node->line;
    pcVar23 = "%s:%d: nameless enum\n";
  }
  else {
    iVar3 = strcmp((char *)pxVar1,"bitset");
    if (iVar3 == 0) {
      p_Var29 = node->properties;
      if (p_Var29 != (_xmlAttr *)0x0) {
        local_50 = (char *)0x0;
        local_58 = (char *)0x0;
        local_48 = (char *)0x0;
        iVar3 = 0;
        iVar6 = 0;
        pcVar23 = (char *)0x0;
        do {
          pxVar1 = p_Var29->name;
          iVar5 = strcmp((char *)pxVar1,"name");
          if (iVar5 == 0) {
            pcVar23 = getattrib(db,file,(uint)node->line,p_Var29);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"bare");
            if (iVar5 == 0) {
              iVar3 = getboolattrib(db,file,(uint)node->line,p_Var29);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"inline");
              if (iVar5 == 0) {
                iVar6 = getboolattrib(db,file,(uint)node->line,p_Var29);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"prefix");
                if (iVar5 == 0) {
                  pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                  local_48 = strdup(pcVar14);
                }
                else {
                  iVar5 = strcmp((char *)pxVar1,"varset");
                  if (iVar5 == 0) {
                    pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                    local_58 = strdup(pcVar14);
                  }
                  else {
                    iVar5 = strcmp((char *)pxVar1,"variants");
                    if (iVar5 == 0) {
                      pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                      local_50 = strdup(pcVar14);
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitset\n",file,
                              (ulong)node->line,pxVar1);
                      db->estatus = 1;
                    }
                  }
                }
              }
            }
          }
          p_Var29 = p_Var29->next;
        } while (p_Var29 != (_xmlAttr *)0x0);
        if (pcVar23 != (char *)0x0) {
          iVar5 = db->bitsetsnum;
          if (0 < (long)iVar5) {
            pprVar16 = db->bitsets;
            lVar27 = 0;
            do {
              prVar10 = pprVar16[lVar27];
              iVar4 = strcmp(prVar10->name,pcVar23);
              if (iVar4 == 0) {
                pcVar23 = (prVar10->varinfo).prefixstr;
                if ((((local_48 != (char *)0x0 || pcVar23 != (char *)0x0) &&
                     (((local_48 == (char *)0x0 || (pcVar23 == (char *)0x0)) ||
                      (iVar5 = strcmp(pcVar23,local_48), iVar5 != 0)))) ||
                    ((pcVar23 = (prVar10->varinfo).varsetstr,
                     local_58 != (char *)0x0 || pcVar23 != (char *)0x0 &&
                     (((local_58 == (char *)0x0 || (pcVar23 == (char *)0x0)) ||
                      (iVar5 = strcmp(pcVar23,local_58), iVar5 != 0)))))) ||
                   (((pcVar23 = (prVar10->varinfo).variantsstr,
                     local_50 != (char *)0x0 || pcVar23 != (char *)0x0 &&
                     (((local_50 == (char *)0x0 || (pcVar23 == (char *)0x0)) ||
                      (iVar5 = strcmp(pcVar23,local_50), iVar5 != 0)))) ||
                    ((prVar10->isinline != iVar6 || (prVar10->bare != iVar3)))))) {
                  fprintf(_stderr,"%s:%d: merge fail for bitset %s\n",file,(ulong)node->line,
                          node->name);
                  db->estatus = 1;
                }
                free(local_48);
                free(local_58);
                free(local_50);
                goto LAB_0010332f;
              }
              lVar27 = lVar27 + 1;
            } while (iVar5 != lVar27);
          }
          prVar10 = (rnnbitset *)calloc(0x70,1);
          pcVar23 = strdup(pcVar23);
          prVar10->name = pcVar23;
          prVar10->isinline = iVar6;
          prVar10->bare = iVar3;
          (prVar10->varinfo).prefixstr = local_48;
          (prVar10->varinfo).varsetstr = local_58;
          (prVar10->varinfo).variantsstr = local_50;
          prVar10->file = file;
          iVar3 = db->bitsetsmax;
          if (iVar5 < iVar3) {
            pprVar16 = db->bitsets;
          }
          else {
            iVar6 = 0x10;
            if (iVar3 != 0) {
              iVar6 = iVar3 * 2;
            }
            db->bitsetsmax = iVar6;
            pprVar16 = (rnnbitset **)realloc(db->bitsets,(long)iVar6 << 3);
            db->bitsets = pprVar16;
            iVar5 = db->bitsetsnum;
          }
          db->bitsetsnum = iVar5 + 1;
          pprVar16[iVar5] = prVar10;
LAB_0010332f:
          p_Var30 = node->children;
          if (p_Var30 != (_xmlNode *)0x0) {
            do {
              if (p_Var30->type == XML_ELEMENT_NODE) {
                iVar3 = strcmp((char *)p_Var30->name,"bitfield");
                if (iVar3 == 0) {
                  prVar17 = parsebitfield(db,file,p_Var30);
                  if (prVar17 != (rnnbitfield *)0x0) {
                    iVar3 = prVar10->bitfieldsnum;
                    iVar6 = prVar10->bitfieldsmax;
                    __ptr_00 = prVar10->bitfields;
                    if (iVar6 <= iVar3) {
                      iVar3 = iVar6 * 2;
                      if (iVar6 == 0) {
                        iVar3 = 0x10;
                      }
                      prVar10->bitfieldsmax = iVar3;
                      __ptr_00 = (rnnbitfield **)realloc(__ptr_00,(long)iVar3 << 3);
                      prVar10->bitfields = __ptr_00;
                      iVar3 = prVar10->bitfieldsnum;
                    }
                    prVar10->bitfieldsnum = iVar3 + 1;
                    __ptr_00[iVar3] = prVar17;
                  }
                }
                else {
                  pcVar23 = file;
                  iVar3 = trytop(db,file,p_Var30);
                  if (iVar3 == 0) {
                    prVar2 = (rnndb *)p_Var30->name;
                    iVar3 = trydoc(prVar2,pcVar23,node_01);
                    if (iVar3 == 0) {
                      fprintf(_stderr,"%s:%d: wrong tag in bitset: <%s>\n",file,(ulong)p_Var30->line
                              ,prVar2);
                      db->estatus = 1;
                    }
                  }
                }
              }
              p_Var30 = p_Var30->next;
            } while (p_Var30 != (_xmlNode *)0x0);
            return 1;
          }
          return 1;
        }
      }
      uVar26 = (ulong)node->line;
      pcVar23 = "%s:%d: nameless bitset\n";
    }
    else {
      iVar3 = strcmp((char *)pxVar1,"group");
      if (iVar3 == 0) {
        p_Var29 = node->properties;
        if (p_Var29 != (_xmlAttr *)0x0) {
          pcVar23 = (char *)0x0;
          do {
            pxVar1 = p_Var29->name;
            iVar3 = strcmp((char *)pxVar1,"name");
            if (iVar3 == 0) {
              pcVar23 = getattrib(db,file,(uint)node->line,p_Var29);
            }
            else {
              fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for group\n",file,(ulong)node->line,
                      pxVar1);
              db->estatus = 1;
            }
            p_Var29 = p_Var29->next;
          } while (p_Var29 != (_xmlAttr *)0x0);
          if (pcVar23 != (char *)0x0) {
            iVar3 = db->groupsnum;
            if (0 < (long)iVar3) {
              pprVar19 = db->groups;
              lVar27 = 0;
              do {
                prVar11 = pprVar19[lVar27];
                iVar6 = strcmp(prVar11->name,pcVar23);
                if (iVar6 == 0) goto LAB_00103586;
                lVar27 = lVar27 + 1;
              } while (iVar3 != lVar27);
            }
            prVar11 = (rnngroup *)calloc(0x18,1);
            pcVar23 = strdup(pcVar23);
            prVar11->name = pcVar23;
            iVar6 = db->groupsmax;
            if (iVar3 < iVar6) {
              pprVar19 = db->groups;
            }
            else {
              iVar3 = 0x10;
              if (iVar6 != 0) {
                iVar3 = iVar6 * 2;
              }
              db->groupsmax = iVar3;
              pprVar19 = (rnngroup **)realloc(db->groups,(long)iVar3 << 3);
              db->groups = pprVar19;
              iVar3 = db->groupsnum;
            }
            db->groupsnum = iVar3 + 1;
            pprVar19[iVar3] = prVar11;
LAB_00103586:
            p_Var30 = node->children;
            if (p_Var30 != (_xmlNode *)0x0) {
              do {
                if (p_Var30->type == XML_ELEMENT_NODE) {
                  prVar24 = trydelem(db,file,p_Var30);
                  if (prVar24 == (rnndelem *)0x0) {
                    pcVar23 = file;
                    iVar3 = trytop(db,file,p_Var30);
                    if (iVar3 == 0) {
                      prVar2 = (rnndb *)p_Var30->name;
                      iVar3 = trydoc(prVar2,pcVar23,node_02);
                      if (iVar3 == 0) {
                        fprintf(_stderr,"%s:%d: wrong tag in group: <%s>\n",file,
                                (ulong)p_Var30->line,prVar2);
                        db->estatus = 1;
                      }
                    }
                  }
                  else {
                    iVar3 = prVar11->subelemsnum;
                    iVar6 = prVar11->subelemsmax;
                    pprVar25 = prVar11->subelems;
                    if (iVar6 <= iVar3) {
                      iVar3 = iVar6 * 2;
                      if (iVar6 == 0) {
                        iVar3 = 0x10;
                      }
                      prVar11->subelemsmax = iVar3;
                      pprVar25 = (rnndelem **)realloc(pprVar25,(long)iVar3 << 3);
                      prVar11->subelems = pprVar25;
                      iVar3 = prVar11->subelemsnum;
                    }
                    prVar11->subelemsnum = iVar3 + 1;
                    pprVar25[iVar3] = prVar24;
                  }
                }
                p_Var30 = p_Var30->next;
              } while (p_Var30 != (_xmlNode *)0x0);
              return 1;
            }
            return 1;
          }
        }
        uVar26 = (ulong)node->line;
        pcVar23 = "%s:%d: nameless group\n";
      }
      else {
        iVar3 = strcmp((char *)pxVar1,"domain");
        if (iVar3 == 0) {
          p_Var29 = node->properties;
          if (p_Var29 != (_xmlAttr *)0x0) {
            local_48 = (char *)0x8;
            local_58 = (char *)0x0;
            local_38 = (char *)0x0;
            local_50 = (char *)0x0;
            iVar3 = 0;
            local_40 = 0;
            pcVar23 = (char *)0x0;
            do {
              pxVar1 = p_Var29->name;
              iVar6 = strcmp((char *)pxVar1,"name");
              if (iVar6 == 0) {
                pcVar23 = getattrib(db,file,(uint)node->line,p_Var29);
              }
              else {
                iVar6 = strcmp((char *)pxVar1,"bare");
                if (iVar6 == 0) {
                  iVar3 = getboolattrib(db,file,(uint)node->line,p_Var29);
                }
                else {
                  iVar6 = strcmp((char *)pxVar1,"size");
                  if (iVar6 == 0) {
                    local_40 = getnumattrib(db,file,(uint)node->line,p_Var29);
                  }
                  else {
                    iVar6 = strcmp((char *)pxVar1,"width");
                    if (iVar6 == 0) {
                      local_48 = (char *)getnumattrib(db,file,(uint)node->line,p_Var29);
                    }
                    else {
                      iVar6 = strcmp((char *)pxVar1,"prefix");
                      if (iVar6 == 0) {
                        pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                        local_50 = strdup(pcVar14);
                      }
                      else {
                        iVar6 = strcmp((char *)pxVar1,"varset");
                        if (iVar6 == 0) {
                          pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                          local_38 = strdup(pcVar14);
                        }
                        else {
                          iVar6 = strcmp((char *)pxVar1,"variants");
                          if (iVar6 == 0) {
                            pcVar14 = getattrib(db,file,(uint)node->line,p_Var29);
                            local_58 = strdup(pcVar14);
                          }
                          else {
                            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for domain\n",file,
                                    (ulong)node->line,pxVar1);
                            db->estatus = 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
              p_Var29 = p_Var29->next;
            } while (p_Var29 != (_xmlAttr *)0x0);
            if (pcVar23 != (char *)0x0) {
              iVar6 = db->domainsnum;
              if (0 < (long)iVar6) {
                pprVar20 = db->domains;
                lVar27 = 0;
                do {
                  prVar15 = pprVar20[lVar27];
                  iVar5 = strcmp(prVar15->name,pcVar23);
                  if (iVar5 == 0) {
                    pcVar23 = (prVar15->varinfo).prefixstr;
                    if (((((local_50 == (char *)0x0 && pcVar23 == (char *)0x0) ||
                          (((local_50 != (char *)0x0 && (pcVar23 != (char *)0x0)) &&
                           (iVar6 = strcmp(pcVar23,local_50), iVar6 == 0)))) &&
                         ((pcVar23 = (prVar15->varinfo).varsetstr,
                          local_38 == (char *)0x0 && pcVar23 == (char *)0x0 ||
                          (((local_38 != (char *)0x0 && (pcVar23 != (char *)0x0)) &&
                           (iVar6 = strcmp(pcVar23,local_38), iVar6 == 0)))))) &&
                        ((pcVar23 = (prVar15->varinfo).variantsstr,
                         local_58 == (char *)0x0 && pcVar23 == (char *)0x0 ||
                         (((local_58 != (char *)0x0 && (pcVar23 != (char *)0x0)) &&
                          (iVar6 = strcmp(pcVar23,local_58), iVar6 == 0)))))) &&
                       ((prVar15->width == (int)local_48 && (prVar15->bare == iVar3)))) {
                      if (local_40 != 0) {
                        if ((prVar15->size != 0) && (local_40 != prVar15->size)) goto LAB_00103ce8;
                        prVar15->size = local_40;
                      }
                    }
                    else {
LAB_00103ce8:
                      fprintf(_stderr,"%s:%d: merge fail for domain %s\n",file,(ulong)node->line,
                              node->name);
                      db->estatus = 1;
                    }
                    free(local_50);
                    free(local_38);
                    free(local_58);
                    goto LAB_00103d33;
                  }
                  lVar27 = lVar27 + 1;
                } while (iVar6 != lVar27);
              }
              prVar15 = (rnndomain *)calloc(0x80,1);
              pcVar23 = strdup(pcVar23);
              prVar15->name = pcVar23;
              prVar15->bare = iVar3;
              prVar15->width = (int)local_48;
              prVar15->size = local_40;
              (prVar15->varinfo).prefixstr = local_50;
              (prVar15->varinfo).varsetstr = local_38;
              (prVar15->varinfo).variantsstr = local_58;
              prVar15->file = file;
              iVar3 = db->domainsmax;
              if (iVar6 < iVar3) {
                pprVar20 = db->domains;
              }
              else {
                iVar6 = 0x10;
                if (iVar3 != 0) {
                  iVar6 = iVar3 * 2;
                }
                db->domainsmax = iVar6;
                pprVar20 = (rnndomain **)realloc(db->domains,(long)iVar6 << 3);
                db->domains = pprVar20;
                iVar6 = db->domainsnum;
              }
              db->domainsnum = iVar6 + 1;
              pprVar20[iVar6] = prVar15;
LAB_00103d33:
              p_Var30 = node->children;
              if (p_Var30 != (_xmlNode *)0x0) {
                do {
                  if (p_Var30->type == XML_ELEMENT_NODE) {
                    prVar24 = trydelem(db,file,p_Var30);
                    if (prVar24 == (rnndelem *)0x0) {
                      pcVar23 = file;
                      iVar3 = trytop(db,file,p_Var30);
                      if (iVar3 == 0) {
                        prVar2 = (rnndb *)p_Var30->name;
                        iVar3 = trydoc(prVar2,pcVar23,node_04);
                        if (iVar3 == 0) {
                          fprintf(_stderr,"%s:%d: wrong tag in domain: <%s>\n",file,
                                  (ulong)p_Var30->line,prVar2);
                          db->estatus = 1;
                        }
                      }
                    }
                    else {
                      iVar3 = prVar15->subelemsnum;
                      iVar6 = prVar15->subelemsmax;
                      pprVar25 = prVar15->subelems;
                      if (iVar6 <= iVar3) {
                        iVar3 = iVar6 * 2;
                        if (iVar6 == 0) {
                          iVar3 = 0x10;
                        }
                        prVar15->subelemsmax = iVar3;
                        pprVar25 = (rnndelem **)realloc(pprVar25,(long)iVar3 << 3);
                        prVar15->subelems = pprVar25;
                        iVar3 = prVar15->subelemsnum;
                      }
                      prVar15->subelemsnum = iVar3 + 1;
                      pprVar25[iVar3] = prVar24;
                    }
                  }
                  p_Var30 = p_Var30->next;
                } while (p_Var30 != (_xmlNode *)0x0);
                return 1;
              }
              return 1;
            }
          }
          uVar26 = (ulong)node->line;
          pcVar23 = "%s:%d: nameless domain\n";
        }
        else {
          iVar3 = strcmp((char *)pxVar1,"spectype");
          if (iVar3 == 0) {
            prVar18 = (rnnspectype *)calloc(0x90,1);
            prVar18->file = file;
            p_Var29 = node->properties;
            if (p_Var29 != (_xmlAttr *)0x0) {
              do {
                iVar3 = strcmp((char *)p_Var29->name,"name");
                if (iVar3 == 0) {
                  pcVar23 = getattrib(db,file,(uint)node->line,p_Var29);
                  pcVar23 = strdup(pcVar23);
                  prVar18->name = pcVar23;
                }
                else {
                  iVar3 = trytypeattr(db,file,node,p_Var29,&prVar18->typeinfo);
                  if (iVar3 == 0) {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for spectype\n",file,
                            (ulong)node->line,p_Var29->name);
                    db->estatus = 1;
                  }
                }
                p_Var29 = p_Var29->next;
              } while (p_Var29 != (_xmlAttr *)0x0);
              pcVar23 = prVar18->name;
              if (pcVar23 != (char *)0x0) {
                iVar3 = db->spectypesnum;
                if (0 < (long)iVar3) {
                  pprVar21 = db->spectypes;
                  lVar27 = 0;
                  do {
                    iVar6 = strcmp(pprVar21[lVar27]->name,pcVar23);
                    if (iVar6 == 0) {
                      fprintf(_stderr,"%s:%d: duplicated spectype name %s\n",file,(ulong)node->line,
                              pcVar23);
                      db->estatus = 1;
                      return 1;
                    }
                    lVar27 = lVar27 + 1;
                  } while (iVar3 != lVar27);
                }
                iVar6 = db->spectypesmax;
                if (iVar3 < iVar6) {
                  pprVar21 = db->spectypes;
                }
                else {
                  iVar3 = 0x10;
                  if (iVar6 != 0) {
                    iVar3 = iVar6 * 2;
                  }
                  db->spectypesmax = iVar3;
                  pprVar21 = (rnnspectype **)realloc(db->spectypes,(long)iVar3 << 3);
                  db->spectypes = pprVar21;
                  iVar3 = db->spectypesnum;
                }
                db->spectypesnum = iVar3 + 1;
                pprVar21[iVar3] = prVar18;
                p_Var30 = node->children;
                if (p_Var30 != (_xmlNode *)0x0) {
                  do {
                    if (((p_Var30->type == XML_ELEMENT_NODE) &&
                        (iVar3 = trytypetag(db,file,p_Var30,&prVar18->typeinfo), iVar3 == 0)) &&
                       (pcVar23 = file, iVar3 = trytop(db,file,p_Var30), iVar3 == 0)) {
                      prVar2 = (rnndb *)p_Var30->name;
                      iVar3 = trydoc(prVar2,pcVar23,node_03);
                      if (iVar3 == 0) {
                        fprintf(_stderr,"%s:%d: wrong tag in spectype: <%s>\n",file,
                                (ulong)p_Var30->line,prVar2);
                        db->estatus = 1;
                      }
                    }
                    p_Var30 = p_Var30->next;
                  } while (p_Var30 != (_xmlNode *)0x0);
                  return 1;
                }
                return 1;
              }
            }
            uVar26 = (ulong)node->line;
            pcVar23 = "%s:%d: nameless spectype\n";
          }
          else {
            iVar3 = strcmp((char *)pxVar1,"import");
            if (iVar3 != 0) {
              iVar3 = strcmp((char *)pxVar1,"copyright");
              if (iVar3 != 0) {
                return 0;
              }
              for (attr = node->properties; attr != (xmlAttr *)0x0; attr = attr->next) {
                pxVar1 = attr->name;
                iVar3 = strcmp((char *)pxVar1,"year");
                if (iVar3 == 0) {
                  uVar8 = getnumattrib(db,file,(uint)node->line,attr);
                  if ((uint)uVar8 <= (db->copyright).firstyear - 1) {
                    (db->copyright).firstyear = (uint)uVar8;
                  }
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for copyright\n",file,
                          (ulong)node->line,pxVar1);
                  db->estatus = 1;
                }
              }
              p_Var30 = node->children;
              if (p_Var30 == (_xmlNode *)0x0) {
                return 1;
              }
              do {
                if (p_Var30->type == XML_ELEMENT_NODE) {
                  pxVar1 = p_Var30->name;
                  iVar3 = strcmp((char *)pxVar1,"license");
                  if (iVar3 == 0) {
                    pcVar23 = (db->copyright).license;
                    if (pcVar23 == (char *)0x0) {
                      pcVar23 = getcontent(p_Var30);
                      (db->copyright).license = pcVar23;
                    }
                    else {
                      iVar3 = strcmp(pcVar23,(char *)node->content);
                      if (iVar3 != 0) {
                        trytop_cold_1();
                        iVar3 = strcmp(pcVar23,"brief");
                        if (iVar3 == 0) {
                          uVar7 = 1;
                        }
                        else {
                          iVar3 = strcmp(pcVar23,"doc");
                          uVar7 = (uint)(iVar3 == 0);
                        }
                        return uVar7;
                      }
                    }
                  }
                  else {
                    iVar3 = strcmp((char *)pxVar1,"author");
                    if (iVar3 == 0) {
                      prVar22 = (rnnauthor *)calloc(0x30,1);
                      p_Var28 = p_Var30->children;
                      p_Var29 = p_Var30->properties;
                      pcVar23 = getcontent(p_Var30);
                      prVar22->contributions = pcVar23;
                      for (; p_Var29 != (xmlAttr *)0x0; p_Var29 = p_Var29->next) {
                        pxVar1 = p_Var29->name;
                        iVar3 = strcmp((char *)pxVar1,"name");
                        if (iVar3 == 0) {
                          pcVar23 = getattrib(db,file,(uint)p_Var30->line,p_Var29);
                          pcVar23 = strdup(pcVar23);
                          prVar22->name = pcVar23;
                        }
                        else {
                          iVar3 = strcmp((char *)pxVar1,"email");
                          if (iVar3 == 0) {
                            pcVar23 = getattrib(db,file,(uint)p_Var30->line,p_Var29);
                            pcVar23 = strdup(pcVar23);
                            prVar22->email = pcVar23;
                          }
                          else {
                            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for author\n",file,
                                    (ulong)p_Var30->line,pxVar1);
                            db->estatus = 1;
                          }
                        }
                      }
                      for (; p_Var28 != (_xmlNode *)0x0; p_Var28 = p_Var28->next) {
                        if (p_Var28->type == XML_ELEMENT_NODE) {
                          pxVar1 = p_Var28->name;
                          iVar3 = strcmp((char *)pxVar1,"nick");
                          if (iVar3 == 0) {
                            p_Var29 = p_Var28->properties;
                            if (p_Var29 != (_xmlAttr *)0x0) {
                              pcVar23 = (char *)0x0;
                              do {
                                pxVar1 = p_Var29->name;
                                iVar3 = strcmp((char *)pxVar1,"name");
                                if (iVar3 == 0) {
                                  pcVar23 = getattrib(db,file,(uint)p_Var28->line,p_Var29);
                                  pcVar23 = strdup(pcVar23);
                                }
                                else {
                                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for nick\n",file,
                                          (ulong)p_Var28->line,pxVar1);
                                  db->estatus = 1;
                                }
                                p_Var29 = p_Var29->next;
                              } while (p_Var29 != (_xmlAttr *)0x0);
                              if (pcVar23 != (char *)0x0) {
                                iVar3 = prVar22->nicknamesnum;
                                iVar6 = prVar22->nicknamesmax;
                                __ptr_01 = prVar22->nicknames;
                                if (iVar6 <= iVar3) {
                                  iVar3 = iVar6 * 2;
                                  if (iVar6 == 0) {
                                    iVar3 = 0x10;
                                  }
                                  prVar22->nicknamesmax = iVar3;
                                  __ptr_01 = (char **)realloc(__ptr_01,(long)iVar3 << 3);
                                  prVar22->nicknames = __ptr_01;
                                  iVar3 = prVar22->nicknamesnum;
                                }
                                prVar22->nicknamesnum = iVar3 + 1;
                                __ptr_01[iVar3] = pcVar23;
                                goto LAB_00103b88;
                              }
                            }
                            fprintf(_stderr,"%s:%d: missing \"name\" attribute for nick\n",file,
                                    (ulong)p_Var28->line);
                          }
                          else {
                            fprintf(_stderr,"%s:%d: wrong tag in author: <%s>\n",file,
                                    (ulong)p_Var28->line,pxVar1);
                          }
                          db->estatus = 1;
                        }
LAB_00103b88:
                      }
                      iVar3 = (db->copyright).authorsnum;
                      iVar6 = (db->copyright).authorsmax;
                      __ptr_02 = (db->copyright).authors;
                      if (iVar6 <= iVar3) {
                        iVar3 = iVar6 * 2;
                        if (iVar6 == 0) {
                          iVar3 = 0x10;
                        }
                        (db->copyright).authorsmax = iVar3;
                        __ptr_02 = (rnnauthor **)realloc(__ptr_02,(long)iVar3 << 3);
                        (db->copyright).authors = __ptr_02;
                        iVar3 = (db->copyright).authorsnum;
                      }
                      (db->copyright).authorsnum = iVar3 + 1;
                      __ptr_02[iVar3] = prVar22;
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong tag in copyright: <%s>\n",file,
                              (ulong)p_Var30->line,pxVar1);
                      db->estatus = 1;
                    }
                  }
                }
                p_Var30 = p_Var30->next;
                if (p_Var30 == (_xmlNode *)0x0) {
                  return 1;
                }
              } while( true );
            }
            p_Var29 = node->properties;
            if (p_Var29 != (_xmlAttr *)0x0) {
              pcVar23 = (char *)0x0;
              do {
                pxVar1 = p_Var29->name;
                iVar3 = strcmp((char *)pxVar1,"file");
                if (iVar3 == 0) {
                  pcVar23 = getattrib(db,file,(uint)node->line,p_Var29);
                }
                else {
                  fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for import\n",file,
                          (ulong)node->line,pxVar1);
                  db->estatus = 1;
                }
                p_Var29 = p_Var29->next;
              } while (p_Var29 != (_xmlAttr *)0x0);
              if (pcVar23 != (char *)0x0) {
                rnn_parsefile(db,pcVar23);
                return 1;
              }
            }
            uVar26 = (ulong)node->line;
            pcVar23 = "%s:%d: missing \"file\" attribute for import\n";
          }
        }
      }
    }
  }
  fprintf(_stderr,pcVar23,file,uVar26);
  db->estatus = 1;
  return 1;
}

Assistant:

static int trytop (struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "enum")) {
		parseenum(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "bitset")) {
		parsebitset(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "group")) {
		parsegroup(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "domain")) {
		parsedomain(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "spectype")) {
		parsespectype(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "import")) {
		xmlAttr *attr = node->properties;
		char *subfile = 0;
		while (attr) {
			if (!strcmp(attr->name, "file")) {
				subfile = getattrib(db, file, node->line, attr);
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for import\n", file, node->line, attr->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!subfile) {
			fprintf (stderr, "%s:%d: missing \"file\" attribute for import\n", file, node->line);
			db->estatus = 1;
		} else {
			rnn_parsefile(db, subfile);
		}
		return 1;
	} else if (!strcmp(node->name, "copyright")) {
		parsecopyright(db, file, node);
		return 1;
	}
	return 0;
}